

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

bool __thiscall libtorrent::aux::torrent::ban_peer(torrent *this,torrent_peer *tp)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unique_lock<std::mutex> local_30;
  
  iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  local_30._M_device = (mutex_type *)(CONCAT44(extraout_var,iVar3) + 0x438);
  local_30._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  uVar1 = *(ulong *)(CONCAT44(extraout_var,iVar3) + 0x428);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_30);
  if (((uVar1 >> 0x32 & 1) != 0) || (-1 < *(int *)&tp->field_0x1b)) {
    need_peer_list(this);
    bVar2 = peer_list::ban_peer((this->super_torrent_hot_members).m_peer_list._M_t.
                                super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                                .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>.
                                _M_head_impl,tp);
    if (bVar2) {
      update_want_peers(this);
      iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x4b])();
      counters::inc_stats_counter((counters *)CONCAT44(extraout_var_00,iVar3),0x31,1);
      return true;
    }
  }
  return false;
}

Assistant:

bool torrent::ban_peer(torrent_peer* tp)
	{
		if (!settings().get_bool(settings_pack::ban_web_seeds) && tp->web_seed)
			return false;

		need_peer_list();
		if (!m_peer_list->ban_peer(tp)) return false;
		update_want_peers();

		inc_stats_counter(counters::num_banned_peers);
		return true;
	}